

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O1

CURLcode Curl_add_custom_headers(Curl_easy *data,_Bool is_connect,dynbuf *req)

{
  connectdata *pcVar1;
  char *first;
  bool bVar2;
  byte *pbVar3;
  byte *pbVar4;
  int iVar5;
  CURLcode CVar6;
  byte *pbVar7;
  byte *pbVar8;
  char *pcVar9;
  byte *pbVar10;
  char *second;
  undefined7 in_register_00000031;
  curl_slist *pcVar11;
  char cVar12;
  curl_slist *h [2];
  CURLcode local_74;
  long local_70;
  curl_slist *local_58 [3];
  dynbuf *local_40;
  long local_38;
  
  local_40 = req;
  pcVar1 = data->conn;
  cVar12 = '\x02';
  if ((int)CONCAT71(in_register_00000031,is_connect) == 0) {
    cVar12 = (*(uint *)&(pcVar1->bits).field_0x4 & 9) == 1;
  }
  if (cVar12 == '\x02') {
    if (((data->set).field_0x9a0 & 0x10) == 0) goto LAB_00124480;
    local_58[0] = (data->set).proxyheaders;
  }
  else {
    if (cVar12 == '\x01') {
      local_58[0] = (data->set).headers;
      local_70 = 1;
      if (((data->set).field_0x9a0 & 0x10) != 0) {
        local_58[1] = (data->set).proxyheaders;
        local_70 = 2;
      }
      goto LAB_001244a1;
    }
LAB_00124480:
    local_58[0] = (data->set).headers;
  }
  local_70 = 1;
LAB_001244a1:
  local_38 = 0;
  do {
    pcVar11 = local_58[local_38];
    while (pcVar11 != (curl_slist *)0x0) {
      pcVar9 = pcVar11->data;
      pbVar7 = (byte *)strchr(pcVar9,0x3a);
      if (pbVar7 == (byte *)0x0) {
        pbVar8 = (byte *)strchr(pcVar9,0x3b);
        bVar2 = true;
        pbVar3 = pbVar8;
        pbVar4 = pbVar8;
        if (pbVar8 == (byte *)0x0) {
          pbVar7 = (byte *)0x0;
          pcVar9 = (char *)0x0;
        }
        else {
          do {
            pbVar7 = pbVar4;
            pbVar10 = pbVar3;
            if (pbVar7[1] == 0) break;
            iVar5 = Curl_isspace((uint)pbVar7[1]);
            pbVar3 = pbVar10 + 1;
            pbVar4 = pbVar7 + 1;
          } while (iVar5 != 0);
          if (pbVar7[1] == 0) {
            if (*pbVar7 == 0x3b) {
              pcVar9 = (*Curl_cstrdup)(pcVar11->data);
              if (pcVar9 == (char *)0x0) {
                Curl_dyn_free(local_40);
                local_74 = CURLE_OUT_OF_MEMORY;
                pcVar9 = (char *)0x0;
                bVar2 = false;
              }
              else {
                pbVar10[(long)pcVar9 - (long)pcVar11->data] = 0x3a;
                pbVar7 = pbVar10 + ((long)pcVar9 - (long)pcVar11->data);
              }
              goto LAB_00124563;
            }
          }
          else {
            pbVar8 = (byte *)0x0;
          }
          pbVar7 = pbVar8;
          pcVar9 = (char *)0x0;
        }
LAB_00124563:
        CVar6 = local_74;
        if (bVar2) goto LAB_0012456c;
LAB_001246ab:
        local_74 = CVar6;
        bVar2 = false;
      }
      else {
        pcVar9 = (char *)0x0;
LAB_0012456c:
        if (pbVar7 != (byte *)0x0) {
          do {
            pbVar7 = pbVar7 + 1;
            if (*pbVar7 == 0) break;
            iVar5 = Curl_isspace((uint)*pbVar7);
          } while (iVar5 != 0);
          if ((pcVar9 != (char *)0x0) || (*pbVar7 != 0)) {
            second = pcVar9;
            if (pcVar9 == (char *)0x0) {
              second = pcVar11->data;
            }
            if ((((((data->state).aptr.host == (char *)0x0) ||
                  (iVar5 = curl_strnequal("Host:",second,5), iVar5 == 0)) &&
                 (((data->state).httpreq != HTTPREQ_POST_FORM ||
                  (iVar5 = curl_strnequal("Content-Type:",second,0xd), iVar5 == 0)))) &&
                ((((data->state).httpreq != HTTPREQ_POST_MIME ||
                  (iVar5 = curl_strnequal("Content-Type:",second,0xd), iVar5 == 0)) &&
                 ((((pcVar1->bits).field_0x6 & 2) == 0 ||
                  (iVar5 = curl_strnequal("Content-Length:",second,0xf), iVar5 == 0)))))) &&
               (((((data->state).aptr.te == (char *)0x0 ||
                  (iVar5 = curl_strnequal("Connection:",second,0xb), iVar5 == 0)) &&
                 ((pcVar1->httpversion < 0x14 ||
                  (iVar5 = curl_strnequal("Transfer-Encoding:",second,0x12), iVar5 == 0)))) &&
                (((((iVar5 = curl_strnequal("Authorization:",second,0xe), iVar5 == 0 &&
                    (iVar5 = curl_strnequal("Cookie:",second,7), iVar5 == 0)) ||
                   (((data->state).field_0x660 & 2) == 0)) ||
                  ((first = (data->state).first_host, first == (char *)0x0 ||
                   (((data->set).field_0x9a3 & 1) != 0)))) ||
                 (iVar5 = Curl_strcasecompare(first,(pcVar1->host).name), iVar5 != 0)))))) {
              CVar6 = Curl_dyn_addf(local_40,"%s\r\n",second);
            }
            else {
              CVar6 = CURLE_OK;
            }
            if (pcVar9 != (char *)0x0) {
              (*Curl_cfree)(pcVar9);
            }
            if (CVar6 != CURLE_OK) goto LAB_001246ab;
          }
        }
        pcVar11 = pcVar11->next;
        bVar2 = true;
      }
      if (!bVar2) {
        return local_74;
      }
    }
    local_38 = local_38 + 1;
    if (local_38 == local_70) {
      return CURLE_OK;
    }
  } while( true );
}

Assistant:

CURLcode Curl_add_custom_headers(struct Curl_easy *data,
                                 bool is_connect,
#ifndef USE_HYPER
                                 struct dynbuf *req
#else
                                 void *req
#endif
  )
{
  struct connectdata *conn = data->conn;
  char *ptr;
  struct curl_slist *h[2];
  struct curl_slist *headers;
  int numlists = 1; /* by default */
  int i;

#ifndef CURL_DISABLE_PROXY
  enum proxy_use proxy;

  if(is_connect)
    proxy = HEADER_CONNECT;
  else
    proxy = conn->bits.httpproxy && !conn->bits.tunnel_proxy?
      HEADER_PROXY:HEADER_SERVER;

  switch(proxy) {
  case HEADER_SERVER:
    h[0] = data->set.headers;
    break;
  case HEADER_PROXY:
    h[0] = data->set.headers;
    if(data->set.sep_headers) {
      h[1] = data->set.proxyheaders;
      numlists++;
    }
    break;
  case HEADER_CONNECT:
    if(data->set.sep_headers)
      h[0] = data->set.proxyheaders;
    else
      h[0] = data->set.headers;
    break;
  }
#else
  (void)is_connect;
  h[0] = data->set.headers;
#endif

  /* loop through one or two lists */
  for(i = 0; i < numlists; i++) {
    headers = h[i];

    while(headers) {
      char *semicolonp = NULL;
      ptr = strchr(headers->data, ':');
      if(!ptr) {
        char *optr;
        /* no colon, semicolon? */
        ptr = strchr(headers->data, ';');
        if(ptr) {
          optr = ptr;
          ptr++; /* pass the semicolon */
          while(*ptr && ISSPACE(*ptr))
            ptr++;

          if(*ptr) {
            /* this may be used for something else in the future */
            optr = NULL;
          }
          else {
            if(*(--ptr) == ';') {
              /* copy the source */
              semicolonp = strdup(headers->data);
              if(!semicolonp) {
#ifndef USE_HYPER
                Curl_dyn_free(req);
#endif
                return CURLE_OUT_OF_MEMORY;
              }
              /* put a colon where the semicolon is */
              semicolonp[ptr - headers->data] = ':';
              /* point at the colon */
              optr = &semicolonp [ptr - headers->data];
            }
          }
          ptr = optr;
        }
      }
      if(ptr) {
        /* we require a colon for this to be a true header */

        ptr++; /* pass the colon */
        while(*ptr && ISSPACE(*ptr))
          ptr++;

        if(*ptr || semicolonp) {
          /* only send this if the contents was non-blank or done special */
          CURLcode result = CURLE_OK;
          char *compare = semicolonp ? semicolonp : headers->data;

          if(data->state.aptr.host &&
             /* a Host: header was sent already, don't pass on any custom Host:
                header as that will produce *two* in the same request! */
             checkprefix("Host:", compare))
            ;
          else if(data->state.httpreq == HTTPREQ_POST_FORM &&
                  /* this header (extended by formdata.c) is sent later */
                  checkprefix("Content-Type:", compare))
            ;
          else if(data->state.httpreq == HTTPREQ_POST_MIME &&
                  /* this header is sent later */
                  checkprefix("Content-Type:", compare))
            ;
          else if(conn->bits.authneg &&
                  /* while doing auth neg, don't allow the custom length since
                     we will force length zero then */
                  checkprefix("Content-Length:", compare))
            ;
          else if(data->state.aptr.te &&
                  /* when asking for Transfer-Encoding, don't pass on a custom
                     Connection: */
                  checkprefix("Connection:", compare))
            ;
          else if((conn->httpversion >= 20) &&
                  checkprefix("Transfer-Encoding:", compare))
            /* HTTP/2 doesn't support chunked requests */
            ;
          else if((checkprefix("Authorization:", compare) ||
                   checkprefix("Cookie:", compare)) &&
                  /* be careful of sending this potentially sensitive header to
                     other hosts */
                  (data->state.this_is_a_follow &&
                   data->state.first_host &&
                   !data->set.allow_auth_to_other_hosts &&
                   !strcasecompare(data->state.first_host, conn->host.name)))
            ;
          else {
#ifdef USE_HYPER
            result = Curl_hyper_header(data, req, compare);
#else
            result = Curl_dyn_addf(req, "%s\r\n", compare);
#endif
          }
          if(semicolonp)
            free(semicolonp);
          if(result)
            return result;
        }
      }
      headers = headers->next;
    }
  }

  return CURLE_OK;
}